

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult_p.h
# Opt level: O0

void __thiscall QSqlResultPrivate::~QSqlResultPrivate(QSqlResultPrivate *this)

{
  QHash<QString,_QList<int>_> *in_RDI;
  
  in_RDI->d = (Data *)&QSqlDriverPlugin::typeinfo;
  QList<QHolder>::~QList((QList<QHolder> *)0x11eee1);
  QHash<QString,_QList<int>_>::~QHash(in_RDI);
  QList<QVariant>::~QList((QList<QVariant> *)0x11eefd);
  QHash<int,_QFlags<QSql::ParamTypeFlag>_>::~QHash
            ((QHash<int,_QFlags<QSql::ParamTypeFlag>_> *)in_RDI);
  QString::~QString((QString *)0x11ef19);
  QSqlError::~QSqlError((QSqlError *)((QHash<int,_QFlags<QSql::ParamTypeFlag>_> *)in_RDI + 7));
  QString::~QString((QString *)0x11ef35);
  QPointer<QSqlDriver>::~QPointer((QPointer<QSqlDriver> *)0x11ef43);
  return;
}

Assistant:

virtual ~QSqlResultPrivate() = default;